

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RBJ.cpp
# Opt level: O0

void __thiscall Iir::RBJ::BandPass1::setupN(BandPass1 *this,double centerFrequency,double bandWidth)

{
  double in_RDI;
  double in_XMM0_Qa;
  double dVar1;
  double dVar2;
  double in_XMM1_Qa;
  double a2;
  double a1;
  double a0;
  double b2;
  double b1;
  double b0;
  double AL;
  double sn;
  double cs;
  double w0;
  
  dVar1 = cos(in_XMM0_Qa * 6.283185307179586);
  dVar2 = sin(in_XMM0_Qa * 6.283185307179586);
  dVar2 = dVar2 / (in_XMM1_Qa * 2.0);
  Biquad::setCoefficients
            ((Biquad *)(in_XMM1_Qa * dVar2),0.0,-in_XMM1_Qa * dVar2,dVar2 + 1.0,dVar1 * -2.0,
             1.0 - dVar2,in_RDI);
  return;
}

Assistant:

void BandPass1::setupN (double centerFrequency,
			       double bandWidth)
	{
		double w0 = 2 * doublePi * centerFrequency;
		double cs = cos (w0);
		double sn = sin (w0);
		double AL = sn / ( 2 * bandWidth );
		double b0 = bandWidth * AL;// sn / 2;
		double b1 =  0;
		double b2 = -bandWidth * AL;//-sn / 2;
		double a0 =  1 + AL;
		double a1 = -2 * cs;
		double a2 =  1 - AL;
		setCoefficients (a0, a1, a2, b0, b1, b2);
	}